

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitio.cpp
# Opt level: O2

void __thiscall bitio::stream::stream(stream *this,FILE *file,uint64_t buffer_size)

{
  uint8_t *__ptr;
  size_t sVar1;
  
  this->_requires_commit = false;
  this->_reached_eof = false;
  this->_buffer_size = 0;
  this->_current_buffer_size = 0;
  this->_buffer = (uint8_t *)0x0;
  this->_buffer_offset = 0;
  *(undefined8 *)((long)&this->_current_buffer_size + 1) = 0;
  *(undefined8 *)((long)&this->_byte_head + 1) = 0;
  this->_file = file;
  this->_buffer_size = buffer_size;
  __ptr = (uint8_t *)operator_new__(buffer_size);
  this->_buffer = __ptr;
  sVar1 = fread(__ptr,1,buffer_size,(FILE *)file);
  this->_current_buffer_size = sVar1;
  return;
}

Assistant:

bitio::stream::stream(FILE *file, uint64_t buffer_size) {
    this->_file = file;
    this->_buffer_size = buffer_size;
    this->_buffer = new uint8_t [buffer_size];

    _current_buffer_size = std::fread(_buffer, 1, buffer_size, file);
}